

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O3

bool SignTransaction(CMutableTransaction *mtx,SigningProvider *keystore,
                    map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                    *coins,int nHashType,
                    map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                    *input_errors)

{
  _Base_ptr *txout;
  size_t sVar1;
  long lVar2;
  uint nIn;
  const_iterator cVar3;
  pointer pCVar4;
  mapped_type *pmVar5;
  pointer pCVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 uVar11;
  _Alloc_hider _Var12;
  long in_FS_OFFSET;
  bool bVar13;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_bilingual_str>_>,_std::_Rb_tree_iterator<std::pair<const_int,_bilingual_str>_>_>
  pVar14;
  vector<CTxOut,_std::allocator<CTxOut>_> spent_outputs;
  ScriptError serror;
  SignatureData sigdata;
  PrecomputedTransactionData txdata;
  CTransaction txConst;
  uint local_64c;
  vector<CTxOut,_std::allocator<CTxOut>_> local_648;
  char *local_630;
  string local_628;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_608;
  long local_600;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5e8;
  long local_5e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d8;
  undefined1 local_5c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558 [2];
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_510 [34];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0 [16];
  undefined1 local_d8 [32];
  CTransaction local_b8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CTransaction::CTransaction(&local_b8,mtx);
  memset(local_1e0,0,0x102);
  local_d8._0_8_ = 0;
  local_d8[8] = 0;
  local_d8._9_7_ = 0;
  local_d8[0x10] = 0;
  local_d8._17_8_ = 0;
  local_648.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_648.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_648.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pCVar4 = (mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar6 = (mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar6 != pCVar4) {
    uVar10 = 0;
    uVar8 = 1;
    do {
      cVar3 = std::
              _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
              ::find(&coins->_M_t,&pCVar4[uVar10].prevout);
      if (((_Rb_tree_header *)cVar3._M_node == &(coins->_M_t)._M_impl.super__Rb_tree_header) ||
         (cVar3._M_node[2]._M_parent == (_Base_ptr)0xffffffffffffffff)) {
        local_578._0_8_ = (pointer)0x0;
        local_578._8_8_ = (pointer)0x0;
        local_568._0_8_ = (pointer)0x0;
        PrecomputedTransactionData::Init<CTransaction>
                  ((PrecomputedTransactionData *)local_1e0,&local_b8,
                   (vector<CTxOut,_std::allocator<CTxOut>_> *)local_578,true);
        std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                  ((vector<CTxOut,_std::allocator<CTxOut>_> *)local_578);
        pCVar4 = (mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pCVar6 = (mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        break;
      }
      std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long_const&,CScript_const&>
                ((vector<CTxOut,std::allocator<CTxOut>> *)&local_648,
                 (long *)&cVar3._M_node[2]._M_parent,(CScript *)&cVar3._M_node[2]._M_left);
      pCVar4 = (mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      pCVar6 = (mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar10 = ((long)pCVar6 - (long)pCVar4 >> 3) * 0x4ec4ec4ec4ec4ec5;
      bVar13 = uVar8 <= uVar10;
      lVar2 = uVar10 - uVar8;
      uVar10 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar13 && lVar2 != 0);
  }
  if (((long)local_648.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_648.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 +
      ((long)pCVar6 - (long)pCVar4 >> 3) * -0x4ec4ec4ec4ec4ec5 == 0) {
    PrecomputedTransactionData::Init<CTransaction>
              ((PrecomputedTransactionData *)local_1e0,&local_b8,&local_648,true);
    pCVar4 = (mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar6 = (mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if (pCVar6 != pCVar4) {
    uVar10 = 1;
    uVar8 = 0;
    do {
      uVar9 = uVar10;
      pCVar4 = pCVar4 + uVar8;
      cVar3 = std::
              _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
              ::find(&coins->_M_t,&pCVar4->prevout);
      nIn = (int)uVar9 - 1;
      if (((_Rb_tree_header *)cVar3._M_node == &(coins->_M_t)._M_impl.super__Rb_tree_header) ||
         (cVar3._M_node[2]._M_parent == (_Base_ptr)0xffffffffffffffff)) {
        local_578._0_8_ = local_568;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_578,"Input not found or already spent","");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_558[0]._M_dataplus._M_p = (pointer)&local_558[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_568 + 0x10),"Input not found or already spent","");
        }
        else {
          local_5c8._0_8_ = "Input not found or already spent";
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_568 + 0x10),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                     (char **)local_5c8);
        }
        local_5c8._0_4_ = nIn;
        pmVar5 = std::
                 map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                 ::operator[](input_errors,(key_type_conflict1 *)local_5c8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&pmVar5->original,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_578);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&pmVar5->translated,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_568 + 0x10));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558[0]._M_dataplus._M_p != &local_558[0].field_2) {
          operator_delete(local_558[0]._M_dataplus._M_p,
                          local_558[0].field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_578._0_8_ != (pointer)local_568) {
          operator_delete((void *)local_578._0_8_,(ulong)(local_568._0_8_ + 1));
        }
      }
      else {
        txout = &cVar3._M_node[2]._M_parent;
        DataFromTransaction((SignatureData *)local_578,mtx,nIn,(CTxOut *)txout);
        if (((nHashType & 0xffffff7fU) != 3) ||
           (uVar10 = ((long)(mtx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(mtx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,
           uVar8 <= uVar10 && uVar10 - uVar8 != 0)) {
          MutableTransactionSignatureCreator::MutableTransactionSignatureCreator
                    ((MutableTransactionSignatureCreator *)local_5c8,mtx,nIn,(CAmount *)txout,
                     (PrecomputedTransactionData *)local_1e0,nHashType);
          ProduceSignature(keystore,(BaseSignatureCreator *)local_5c8,
                           (CScript *)&cVar3._M_node[2]._M_left,(SignatureData *)local_578);
        }
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&(pCVar4->scriptSig).super_CScriptBase,
                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)(local_578 + 8));
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator=(&(pCVar4->scriptWitness).stack,local_510);
        if ((*txout == (_Base_ptr)0x775f05a074000) &&
           ((pCVar4->scriptWitness).stack.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pCVar4->scriptWitness).stack.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          local_5c8._0_8_ = local_5c8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_5c8,"Missing amount","");
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_5a8,"Missing amount","");
          }
          else {
            local_630 = "Missing amount";
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      (&local_5a8,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,&local_630);
          }
          local_630 = (char *)CONCAT44(local_630._4_4_,nIn);
          pmVar5 = std::
                   map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                   ::operator[](input_errors,(key_type_conflict1 *)&local_630);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&pmVar5->original,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8)
          ;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&pmVar5->translated,&local_5a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
            operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5c8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_5c8 + 0x10)) {
            uVar11 = CONCAT44(local_5c8._20_4_,local_5c8._16_4_);
            _Var12._M_p = (pointer)local_5c8._0_8_;
            goto LAB_003c1fc0;
          }
          goto LAB_003c19ca;
        }
        local_630 = (char *)((ulong)local_630 & 0xffffffff00000000);
        if (local_578[0] == (string)0x0) {
          local_5c8._0_8_ = &PTR_CheckECDSASignature_006bdc08;
          local_5c8._8_8_ = &local_b8;
          local_5c8._16_4_ = 1;
          local_5a8._M_dataplus._M_p = (pointer)local_1e0;
          local_5c8._20_4_ = nIn;
          local_5c8._24_8_ = *txout;
          bVar13 = VerifyScript(&pCVar4->scriptSig,(CScript *)&cVar3._M_node[2]._M_left,
                                &pCVar4->scriptWitness,0x1fffdf,(BaseSignatureChecker *)local_5c8,
                                (ScriptError *)&local_630);
          if (bVar13) goto LAB_003c199f;
          if ((ScriptError)local_630 == SCRIPT_ERR_SIG_NULLFAIL) {
            local_608 = &local_5f8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_608,
                       "CHECK(MULTI)SIG failing with non-zero signature (possibly need more signatures)"
                       ,"");
            local_5c8._0_8_ = local_5c8 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_5c8,local_608,local_600 + (long)local_608);
            local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_5a8,local_608,local_600 + (long)local_608);
            local_64c = nIn;
            pmVar5 = std::
                     map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                     ::operator[](input_errors,(key_type_conflict1 *)&local_64c);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&pmVar5->original,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8
                     );
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&pmVar5->translated,&local_5a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
              operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5c8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_5c8 + 0x10)) {
              operator_delete((void *)local_5c8._0_8_,
                              CONCAT44(local_5c8._20_4_,local_5c8._16_4_) + 1);
            }
            uVar11 = local_5f8._M_allocated_capacity;
            _Var12._M_p = (pointer)local_608;
            if (local_608 != &local_5f8) goto LAB_003c1fc0;
          }
          else if ((ScriptError)local_630 == SCRIPT_ERR_INVALID_STACK_OPERATION) {
            local_5e8 = &local_5d8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_5e8,
                       "Unable to sign input, invalid stack size (possibly missing key)","");
            local_5c8._0_8_ = local_5c8 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_5c8,local_5e8,local_5e0 + (long)local_5e8);
            local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_5a8,local_5e8,local_5e0 + (long)local_5e8);
            local_64c = nIn;
            pmVar5 = std::
                     map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                     ::operator[](input_errors,(key_type_conflict1 *)&local_64c);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&pmVar5->original,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8
                     );
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&pmVar5->translated,&local_5a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
              operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5c8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_5c8 + 0x10)) {
              operator_delete((void *)local_5c8._0_8_,
                              CONCAT44(local_5c8._20_4_,local_5c8._16_4_) + 1);
            }
            uVar11 = local_5d8._M_allocated_capacity;
            _Var12._M_p = (pointer)local_5e8;
            if (local_5e8 != &local_5d8) {
LAB_003c1fc0:
              operator_delete(_Var12._M_p,uVar11 + 1);
            }
          }
          else {
            ScriptErrorString_abi_cxx11_(&local_628,(ScriptError)local_630);
            local_5c8._0_8_ = local_5c8 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_5c8,local_628._M_dataplus._M_p,
                       local_628._M_dataplus._M_p + local_628._M_string_length);
            local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_5a8,local_628._M_dataplus._M_p,
                       local_628._M_dataplus._M_p + local_628._M_string_length);
            local_64c = nIn;
            pmVar5 = std::
                     map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                     ::operator[](input_errors,(key_type_conflict1 *)&local_64c);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&pmVar5->original,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8
                     );
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&pmVar5->translated,&local_5a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
              operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5c8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_5c8 + 0x10)) {
              operator_delete((void *)local_5c8._0_8_,
                              CONCAT44(local_5c8._20_4_,local_5c8._16_4_) + 1);
            }
            uVar11 = local_628.field_2._M_allocated_capacity;
            _Var12._M_p = local_628._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_628._M_dataplus._M_p != &local_628.field_2) goto LAB_003c1fc0;
          }
        }
        else {
LAB_003c199f:
          local_5c8._0_4_ = nIn;
          pVar14 = std::
                   _Rb_tree<int,_std::pair<const_int,_bilingual_str>,_std::_Select1st<std::pair<const_int,_bilingual_str>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                   ::equal_range(&input_errors->_M_t,(key_type_conflict1 *)local_5c8);
          std::
          _Rb_tree<int,_std::pair<const_int,_bilingual_str>,_std::_Select1st<std::pair<const_int,_bilingual_str>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
          ::_M_erase_aux(&input_errors->_M_t,(_Base_ptr)pVar14.first._M_node,
                         (_Base_ptr)pVar14.second._M_node);
        }
LAB_003c19ca:
        SignatureData::~SignatureData((SignatureData *)local_578);
      }
      pCVar4 = (mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = ((long)(mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar4 >> 3) * 0x4ec4ec4ec4ec4ec5;
      uVar10 = (ulong)((int)uVar9 + 1);
      uVar8 = uVar9;
    } while (uVar9 <= uVar7 && uVar7 - uVar9 != 0);
  }
  sVar1 = (input_errors->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_648);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)((long)local_1e0 + 0x108));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_b8.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_b8.vin);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return sVar1 == 0;
}

Assistant:

bool SignTransaction(CMutableTransaction& mtx, const SigningProvider* keystore, const std::map<COutPoint, Coin>& coins, int nHashType, std::map<int, bilingual_str>& input_errors)
{
    bool fHashSingle = ((nHashType & ~SIGHASH_ANYONECANPAY) == SIGHASH_SINGLE);

    // Use CTransaction for the constant parts of the
    // transaction to avoid rehashing.
    const CTransaction txConst(mtx);

    PrecomputedTransactionData txdata;
    std::vector<CTxOut> spent_outputs;
    for (unsigned int i = 0; i < mtx.vin.size(); ++i) {
        CTxIn& txin = mtx.vin[i];
        auto coin = coins.find(txin.prevout);
        if (coin == coins.end() || coin->second.IsSpent()) {
            txdata.Init(txConst, /*spent_outputs=*/{}, /*force=*/true);
            break;
        } else {
            spent_outputs.emplace_back(coin->second.out.nValue, coin->second.out.scriptPubKey);
        }
    }
    if (spent_outputs.size() == mtx.vin.size()) {
        txdata.Init(txConst, std::move(spent_outputs), true);
    }

    // Sign what we can:
    for (unsigned int i = 0; i < mtx.vin.size(); ++i) {
        CTxIn& txin = mtx.vin[i];
        auto coin = coins.find(txin.prevout);
        if (coin == coins.end() || coin->second.IsSpent()) {
            input_errors[i] = _("Input not found or already spent");
            continue;
        }
        const CScript& prevPubKey = coin->second.out.scriptPubKey;
        const CAmount& amount = coin->second.out.nValue;

        SignatureData sigdata = DataFromTransaction(mtx, i, coin->second.out);
        // Only sign SIGHASH_SINGLE if there's a corresponding output:
        if (!fHashSingle || (i < mtx.vout.size())) {
            ProduceSignature(*keystore, MutableTransactionSignatureCreator(mtx, i, amount, &txdata, nHashType), prevPubKey, sigdata);
        }

        UpdateInput(txin, sigdata);

        // amount must be specified for valid segwit signature
        if (amount == MAX_MONEY && !txin.scriptWitness.IsNull()) {
            input_errors[i] = _("Missing amount");
            continue;
        }

        ScriptError serror = SCRIPT_ERR_OK;
        if (!sigdata.complete && !VerifyScript(txin.scriptSig, prevPubKey, &txin.scriptWitness, STANDARD_SCRIPT_VERIFY_FLAGS, TransactionSignatureChecker(&txConst, i, amount, txdata, MissingDataBehavior::FAIL), &serror)) {
            if (serror == SCRIPT_ERR_INVALID_STACK_OPERATION) {
                // Unable to sign input and verification failed (possible attempt to partially sign).
                input_errors[i] = Untranslated("Unable to sign input, invalid stack size (possibly missing key)");
            } else if (serror == SCRIPT_ERR_SIG_NULLFAIL) {
                // Verification failed (possibly due to insufficient signatures).
                input_errors[i] = Untranslated("CHECK(MULTI)SIG failing with non-zero signature (possibly need more signatures)");
            } else {
                input_errors[i] = Untranslated(ScriptErrorString(serror));
            }
        } else {
            // If this input succeeds, make sure there is no error set for it
            input_errors.erase(i);
        }
    }
    return input_errors.empty();
}